

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O1

bool __thiscall
lzham::task_pool::queue_task(task_pool *this,executable_task *pObj,uint64 data,void *pData_ptr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = pthread_spin_lock((pthread_spinlock_t *)this);
  if (iVar1 != 0) {
    lzham_fail("\"spinlock: pthread_spin_lock() failed\"",
               "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
               ,0xf4);
  }
  iVar1 = (this->m_task_stack).m_top;
  lVar3 = (long)iVar1;
  if (lVar3 < 0x40) {
    (this->m_task_stack).m_top = iVar1 + 1;
    (this->m_task_stack).m_stack[lVar3].m_data = data;
    (this->m_task_stack).m_stack[lVar3].m_pData_ptr = pData_ptr;
    (this->m_task_stack).m_stack[lVar3].field_2.m_pObj = pObj;
    (this->m_task_stack).m_stack[lVar3].m_flags = 1;
  }
  iVar2 = pthread_spin_unlock((pthread_spinlock_t *)this);
  if (iVar2 != 0) {
    lzham_fail("\"spinlock: pthread_spin_unlock() failed\"",
               "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
               ,0xfc);
  }
  if (iVar1 < 0x40) {
    LOCK();
    this->m_num_outstanding_tasks = this->m_num_outstanding_tasks + 1;
    UNLOCK();
    iVar2 = sem_post((sem_t *)&this->m_tasks_available);
    if (iVar2 != 0) {
      lzham_fail("\"semaphore: sem_post() or sem_post_multiple() failed\"",
                 "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                 ,0x9f);
    }
  }
  return iVar1 < 0x40;
}

Assistant:

bool task_pool::queue_task(executable_task* pObj, uint64 data, void* pData_ptr)
   {
      LZHAM_ASSERT(m_num_threads);
      LZHAM_ASSERT(pObj);

      task tsk;
      tsk.m_pObj = pObj;
      tsk.m_data = data;
      tsk.m_pData_ptr = pData_ptr;
      tsk.m_flags = cTaskFlagObject;

      if (!m_task_stack.try_push(tsk))
         return false;

      atomic_increment32(&m_num_outstanding_tasks);

      m_tasks_available.release(1);

      return true;
   }